

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t writen(int fd,void *buff,size_t n)

{
  ssize_t sVar1;
  int *piVar2;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  char *ptr;
  ssize_t writeSum;
  ssize_t nwriten;
  size_t nleft;
  void *local_40;
  long local_38;
  size_t local_28;
  ssize_t local_8;
  
  local_38 = 0;
  local_40 = in_RSI;
  local_28 = in_RDX;
  do {
    while( true ) {
      if (local_28 == 0) {
        return local_38;
      }
      sVar1 = write(in_EDI,local_40,local_28);
      if ((sVar1 < 1) && (sVar1 < 0)) break;
      local_38 = sVar1 + local_38;
      local_28 = local_28 - sVar1;
      local_40 = (void *)(sVar1 + (long)local_40);
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  piVar2 = __errno_location();
  if (*piVar2 == 0xb) {
    local_8 = local_38;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

ssize_t writen(int fd, void *buff, size_t n){
    size_t nleft=n;
    ssize_t nwriten=0;
    ssize_t writeSum=0;
    char* ptr=(char*) buff;

    while (nleft>0) {
        if((nwriten=write(fd, ptr, nleft))<=0){
            if(nwriten<0){
                if(errno==EINTR){
                    nwriten=0;
                    continue;
                }else if (errno==EAGAIN) {
                    return writeSum;
                }else {
                    return -1;
                }
            }
        }
        writeSum+=nwriten;
        nleft-=nwriten;
        ptr+=nwriten;
    }
    return writeSum;
}